

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

bool dg::vr::RelationsGraph<dg::vr::ValueRelations>::processEdge
               (RelationEdge *edge,Type strictRel,Relations *updated,bool toFirstStrict,
               Visited *firstStrictEdges)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  const_iterator cVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)strictRel;
  cVar2 = dg::vr::Relations::transitiveOver(strictRel,edge->_rel);
  if (cVar2 == '\0') {
    return true;
  }
  if (toFirstStrict) {
    if (((updated->bits).super__Base_bitset<1UL>._M_w >> (uVar5 & 0x3f) & 1) != 0) {
      cVar4 = std::
              _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
              ::find(&firstStrictEdges->_M_t,edge);
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(firstStrictEdges->_M_t)._M_impl.super__Rb_tree_header) {
        return true;
      }
      if (PF < strictRel) {
LAB_00123203:
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar5,0xc);
      }
      bVar1 = (byte)strictRel & 0x3f;
      (updated->bits).super__Base_bitset<1UL>._M_w =
           (updated->bits).super__Base_bitset<1UL>._M_w &
           (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      uVar3 = dg::vr::Relations::getNonStrict(strictRel);
      uVar5 = (ulong)uVar3;
      if (0xb < uVar3) goto LAB_00123203;
      uVar5 = (updated->bits).super__Base_bitset<1UL>._M_w & ~(1L << (uVar5 & 0x3f));
      bVar6 = true;
      goto LAB_001231ef;
    }
    uVar3 = dg::vr::Relations::getNonStrict(strictRel);
    uVar5 = (ulong)uVar3;
    if (0xb < uVar3) goto LAB_00123203;
    uVar5 = (updated->bits).super__Base_bitset<1UL>._M_w & ~(1L << (uVar5 & 0x3f));
  }
  else {
    uVar5 = (ulong)strictRel;
    if (PF < strictRel) goto LAB_00123203;
    uVar5 = (updated->bits).super__Base_bitset<1UL>._M_w | 1L << (uVar5 & 0x3f);
  }
  bVar6 = false;
LAB_001231ef:
  (updated->bits).super__Base_bitset<1UL>._M_w = uVar5;
  return bVar6;
}

Assistant:

static bool processEdge(const Bucket::RelationEdge &edge,
                            Relations::Type strictRel, Relations &updated,
                            bool toFirstStrict,
                            const Bucket::iterator::Visited &firstStrictEdges) {
        if (!Relations::transitiveOver(strictRel,
                                       edge.rel())) // edge not relevant
            return true;
        if (!toFirstStrict) { // finding all strictly related
            updated.set(strictRel);
            return false;
        }
        // else unsetting all that are not really first strict

        bool targetOfFSE = updated.has(strictRel); // FSE = first strict edge

        if (!targetOfFSE) {
            updated.set(Relations::getNonStrict(strictRel), false);
            return false;
        }

        // else possible false strict
        bool thisIsFSE = firstStrictEdges.find(edge) != firstStrictEdges.end();

        if (thisIsFSE) { // strict relation set by false first strict
            updated.set(strictRel, false);
            updated.set(Relations::getNonStrict(strictRel), false);
        }
        return true; // skip because search will happen from target sooner or
                     // later
    }